

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O2

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryPage::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryPage *this,VkDeviceSize size,
          VkDeviceSize alignment)

{
  unsigned_long val;
  type tVar1;
  char (*Args_1) [126];
  Allocation AVar2;
  string msg;
  
  Args_1 = (char (*) [126])alignment;
  std::mutex::lock(&this->m_Mutex);
  AVar2 = Diligent::VariableSizeAllocationsManager::Allocate(&this->m_AllocationMgr,size,alignment);
  val = AVar2.UnalignedOffset;
  if (val == 0xffffffffffffffff) {
    __return_storage_ptr__->Page = (VulkanMemoryPage *)0x0;
    __return_storage_ptr__->UnalignedOffset = 0;
    __return_storage_ptr__->Size = 0;
  }
  else {
    tVar1 = Diligent::AlignUp<unsigned_long,unsigned_long>(val,alignment);
    if (AVar2.Size < (tVar1 - val) + size) {
      Diligent::FormatString<char[26],char[126]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Diligent::AlignUp(VkDeviceSize{Allocation.UnalignedOffset}, alignment) - Allocation.UnalignedOffset + size <= Allocation.Size"
                 ,Args_1);
      Diligent::DebugAssertionFailed
                (msg._M_dataplus._M_p,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,0x6e);
      std::__cxx11::string::~string((string *)&msg);
    }
    __return_storage_ptr__->Page = this;
    __return_storage_ptr__->UnalignedOffset = AVar2.UnalignedOffset;
    __return_storage_ptr__->Size = AVar2.Size;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return __return_storage_ptr__;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryPage::Allocate(VkDeviceSize size, VkDeviceSize alignment)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    VERIFY(size <= std::numeric_limits<AllocationsMgrOffsetType>::max(),
           "Allocation size (", size, ") exceeds maximum allowed value ",
           std::numeric_limits<AllocationsMgrOffsetType>::max());
    auto Allocation = m_AllocationMgr.Allocate(static_cast<AllocationsMgrOffsetType>(size), static_cast<AllocationsMgrOffsetType>(alignment));
    if (Allocation.IsValid())
    {
        // Offset may not necessarily be aligned, but the allocation is guaranteed to be large enough
        // to accommodate requested alignment
        VERIFY_EXPR(Diligent::AlignUp(VkDeviceSize{Allocation.UnalignedOffset}, alignment) - Allocation.UnalignedOffset + size <= Allocation.Size);
        return VulkanMemoryAllocation{this, Allocation.UnalignedOffset, Allocation.Size};
    }
    else
    {
        return VulkanMemoryAllocation{};
    }
}